

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O0

bool GetN(BLH blh,ELLIPSOID ellipsoid,double *N)

{
  double dVar1;
  double sub;
  double sinB;
  double *N_local;
  
  dVar1 = Deg2Rad(blh.B);
  dVar1 = sin(dVar1);
  dVar1 = sqrt(-(ellipsoid.e2 * dVar1) * dVar1 + 1.0);
  if (1e-06 < dVar1) {
    *N = ellipsoid.a / dVar1;
  }
  return 1e-06 < dVar1;
}

Assistant:

bool GetN(const BLH blh, const ELLIPSOID ellipsoid, double &N)
{
    double sinB = sin(Deg2Rad(blh.B));
    double sub = sqrt(1 - ellipsoid.e2 * sinB * sinB);
    if(sub <= 1e-6)
        return false;
    N = ellipsoid.a / sub;

    return true;
}